

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  XmlWriter *in_RSI;
  undefined8 *in_RDI;
  ReporterConfig *in_stack_000000a8;
  CumulativeReporterBase<Catch::JunitReporter> *in_stack_000000b0;
  ostream *in_stack_ffffffffffffffe8;
  
  CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
            (in_stack_000000b0,in_stack_000000a8);
  *in_RDI = &PTR__JunitReporter_00287c48;
  ReporterConfig::stream((ReporterConfig *)in_RSI);
  XmlWriter::XmlWriter(in_RSI,in_stack_ffffffffffffffe8);
  Timer::Timer((Timer *)(in_RDI + 0x24));
  std::__cxx11::string::string((string *)(in_RDI + 0x25));
  std::__cxx11::string::string((string *)(in_RDI + 0x29));
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  *(undefined1 *)((long)in_RDI + 0x16c) = 0;
  *(undefined1 *)(in_RDI + 0x1a) = 1;
  *(undefined1 *)((long)in_RDI + 0xd1) = 1;
  return;
}

Assistant:

JunitReporter::JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
            m_reporterPrefs.shouldReportAllAssertions = true;
        }